

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Card *card)

{
  char *pcVar1;
  ostream *poVar2;
  string local_68 [48];
  string local_38 [32];
  Card *local_18;
  Card *card_local;
  ostream *os_local;
  
  local_18 = card;
  card_local = (Card *)os;
  suitName_abi_cxx11_((Suit)local_38);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(os,pcVar1);
  valueName_abi_cxx11_((CardValue)local_68);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::operator<<(poVar2,pcVar1);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return (ostream *)card_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Card &card) {
    os << suitName(card.m_suit).c_str() << valueName(card.m_value).c_str();
    return os;
}